

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

void __thiscall
flatbuffers::ts::TsGenerator::GenStructBody
          (TsGenerator *this,StructDef *struct_def,string *body,string *nameprefix)

{
  StructDef *pSVar1;
  string *body_00;
  bool bVar2;
  reference ppFVar3;
  long lVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  undefined4 local_684;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  string local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  byte local_5d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  undefined1 local_5b8 [8];
  string fname_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  Type local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  byte local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  undefined1 local_470 [8];
  string fname_1;
  string str_last_item_idx_1;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [8];
  string pack_func_create_call;
  string class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  byte local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  string str_last_item_idx;
  BaseType element_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  FieldDef *local_d0;
  FieldDef *field;
  undefined1 local_c0 [8];
  const_reverse_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *nameprefix_local;
  string *body_local;
  StructDef *struct_def_local;
  TsGenerator *this_local;
  
  local_28 = nameprefix;
  nameprefix_local = body;
  body_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  std::__cxx11::string::operator+=((string *)body,"  builder.prep(");
  NumToString<unsigned_long>(&local_68,*(unsigned_long *)((long)&body_local[8].field_2 + 8));
  std::operator+(&local_48,&local_68,", ");
  std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  NumToString<unsigned_long>((string *)&it,*(unsigned_long *)(body_local + 9));
  std::operator+(&local_98,(string *)&it,");\n");
  std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&it);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rbegin
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_c0);
  while( true ) {
    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rend
              ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&field);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)local_c0,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)&field);
    if (!bVar2) break;
    ppFVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                           *)local_c0);
    local_d0 = *ppFVar3;
    if (local_d0->padding != 0) {
      NumToString<unsigned_long>(&local_130,local_d0->padding);
      std::operator+(&local_110,"  builder.pad(",&local_130);
      std::operator+(&local_f0,&local_110,");\n");
      std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
    }
    bVar2 = IsStruct(&(local_d0->value).type);
    body_00 = nameprefix_local;
    if (bVar2) {
      pSVar1 = (local_d0->value).type.struct_def;
      lVar4 = std::__cxx11::string::length();
      str_last_item_idx.field_2._M_local_buf[0xf] = '\0';
      if (lVar4 == 0) {
        std::__cxx11::string::string((string *)&local_150,(string *)local_d0);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &element_type,local_28,"_");
        str_last_item_idx.field_2._M_local_buf[0xf] = '\x01';
        std::operator+(&local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &element_type,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                      );
      }
      GenStructBody(this,pSVar1,body_00,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      if ((str_last_item_idx.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&element_type);
      }
    }
    else {
      str_last_item_idx.field_2._8_4_ = (local_d0->value).type.element;
      if ((local_d0->value).type.base_type == BASE_TYPE_ARRAY) {
        if ((local_d0->value).type.element == BASE_TYPE_STRUCT) {
          NumToString<int>((string *)local_198,(local_d0->value).type.fixed_length - 1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&fname.field_2 + 8),"\n  for (let i = ",(string *)local_198);
          std::operator+(&local_1d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&fname.field_2 + 8),"; i >= 0; --i");
          std::operator+(&local_1b8,&local_1d8,") {\n");
          std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
          lVar4 = std::__cxx11::string::length();
          local_239 = 0;
          if (lVar4 == 0) {
            std::__cxx11::string::string((string *)local_218,(string *)local_d0);
          }
          else {
            std::operator+(&local_238,local_28,"_");
            local_239 = 1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_218,&local_238,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0);
          }
          if ((local_239 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_238);
          }
          std::operator+(&local_280,"    const item = ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_218);
          std::operator+(&local_260,&local_280,"?.[i];\n\n");
          std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_280);
          if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
            GetTypeName_abi_cxx11_
                      ((string *)((long)&class_name.field_2 + 8),this,
                       (local_d0->value).type.struct_def,true,false);
            std::operator+(&local_2c0,"    if (item instanceof ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&class_name.field_2 + 8));
            std::operator+(&local_2a0,&local_2c0,") {\n");
            std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_2a0);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::__cxx11::string::~string((string *)&local_2c0);
            std::__cxx11::string::~string((string *)(class_name.field_2._M_local_buf + 8));
            std::__cxx11::string::operator+=
                      ((string *)nameprefix_local,"      item.pack(builder);\n");
            std::__cxx11::string::operator+=((string *)nameprefix_local,"      continue;\n");
            std::__cxx11::string::operator+=((string *)nameprefix_local,"    }\n\n");
          }
          GetPrefixedName_abi_cxx11_
                    ((string *)((long)&pack_func_create_call.field_2 + 8),this,
                     (local_d0->value).type.struct_def,"");
          std::operator+(&local_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&pack_func_create_call.field_2 + 8),".create");
          std::operator+(&local_340,&local_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&pack_func_create_call.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_320,&local_340,"(builder,\n");
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
          pSVar1 = (local_d0->value).type.struct_def;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"item",&local_3e1)
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,",\n    ",&local_409);
          GenStructMemberValueTS(&local_3c0,this,pSVar1,&local_3e0,&local_408,false);
          std::operator+(&local_3a0,"    ",&local_3c0);
          std::operator+(&local_380,&local_3a0,"\n  ");
          std::__cxx11::string::operator+=((string *)local_320,(string *)&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_408);
          std::allocator<char>::~allocator(&local_409);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::allocator<char>::~allocator(&local_3e1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&str_last_item_idx_1.field_2 + 8),"    ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_320);
          std::__cxx11::string::operator+=
                    ((string *)nameprefix_local,
                     (string *)(str_last_item_idx_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(str_last_item_idx_1.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)nameprefix_local,"  );\n  }\n\n");
          std::__cxx11::string::~string((string *)local_320);
          std::__cxx11::string::~string((string *)(pack_func_create_call.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_218);
          std::__cxx11::string::~string((string *)local_198);
        }
        else {
          NumToString<int>((string *)((long)&fname_1.field_2 + 8),
                           (local_d0->value).type.fixed_length - 1);
          lVar4 = std::__cxx11::string::length();
          local_491 = 0;
          if (lVar4 == 0) {
            std::__cxx11::string::string((string *)local_470,(string *)local_d0);
          }
          else {
            std::operator+(&local_490,local_28,"_");
            local_491 = 1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_470,&local_490,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0);
          }
          if ((local_491 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_490);
          }
          std::operator+(&local_4d8,"\n  for (let i = ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&fname_1.field_2 + 8));
          std::operator+(&local_4b8,&local_4d8,"; i >= 0; --i) {\n");
          std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::operator+=((string *)nameprefix_local,"    builder.write");
          Type::Type(&local_518,(local_d0->value).type.element,(StructDef *)0x0,(EnumDef *)0x0,0);
          GenWriteMethod_abi_cxx11_(&local_4f8,this,&local_518);
          std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_4f8);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::__cxx11::string::operator+=((string *)nameprefix_local,"(");
          pcVar5 = "";
          if (str_last_item_idx.field_2._8_4_ == 2) {
            pcVar5 = "+";
          }
          std::__cxx11::string::operator+=((string *)nameprefix_local,pcVar5);
          if ((str_last_item_idx.field_2._8_4_ == 9) || (str_last_item_idx.field_2._8_4_ == 10)) {
            std::operator+(&local_558,"BigInt(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_470);
            std::operator+(&local_538,&local_558,"?.[i] ?? 0));\n");
            std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_538);
            std::__cxx11::string::~string((string *)&local_538);
            std::__cxx11::string::~string((string *)&local_558);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&fname_2.field_2 + 8),"(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_470);
            std::operator+(&local_578,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&fname_2.field_2 + 8),"?.[i] ?? 0));\n\n");
            std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_578);
            std::__cxx11::string::~string((string *)&local_578);
            std::__cxx11::string::~string((string *)(fname_2.field_2._M_local_buf + 8));
          }
          std::__cxx11::string::operator+=((string *)nameprefix_local,"  }\n\n");
          std::__cxx11::string::~string((string *)local_470);
          std::__cxx11::string::~string((string *)(fname_1.field_2._M_local_buf + 8));
        }
      }
      else {
        lVar4 = std::__cxx11::string::length();
        local_5d9 = 0;
        if (lVar4 == 0) {
          std::__cxx11::string::string((string *)local_5b8,(string *)local_d0);
        }
        else {
          std::operator+(&local_5d8,local_28,"_");
          local_5d9 = 1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5b8,&local_5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
        }
        if ((local_5d9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_5d8);
        }
        GenWriteMethod_abi_cxx11_(&local_640,this,&(local_d0->value).type);
        std::operator+(&local_620,"  builder.write",&local_640);
        std::operator+(&local_600,&local_620,"(");
        std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_600);
        std::__cxx11::string::~string((string *)&local_600);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::~string((string *)&local_640);
        if ((local_d0->value).type.base_type == BASE_TYPE_BOOL) {
          std::operator+(&local_680,"Number(Boolean(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5b8);
          std::operator+(&local_660,&local_680,")));\n");
          std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_660);
          std::__cxx11::string::~string((string *)&local_660);
          std::__cxx11::string::~string((string *)&local_680);
          local_684 = 4;
        }
        else if (((local_d0->value).type.base_type == BASE_TYPE_LONG) ||
                ((local_d0->value).type.base_type == BASE_TYPE_ULONG)) {
          std::operator+(&local_6c8,"BigInt(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5b8);
          std::operator+(&local_6a8,&local_6c8," ?? 0));\n");
          std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_6a8);
          std::__cxx11::string::~string((string *)&local_6a8);
          std::__cxx11::string::~string((string *)&local_6c8);
          local_684 = 4;
        }
        else {
          std::operator+(&local_6e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5b8,");\n");
          std::__cxx11::string::operator+=((string *)nameprefix_local,(string *)&local_6e8);
          std::__cxx11::string::~string((string *)&local_6e8);
          local_684 = 0;
        }
        std::__cxx11::string::~string((string *)local_5b8);
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                  *)local_c0);
  }
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, std::string *body,
                     const std::string &nameprefix) {
    *body += "  builder.prep(";
    *body += NumToString(struct_def.minalign) + ", ";
    *body += NumToString(struct_def.bytesize) + ");\n";

    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding) {
        *body += "  builder.pad(" + NumToString(field.padding) + ");\n";
      }
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructBody(
            *field.value.type.struct_def, body,
            nameprefix.length() ? nameprefix + "_" + field.name : field.name);
      } else {
        auto element_type = field.value.type.element;

        if (field.value.type.base_type == BASE_TYPE_ARRAY) {
          switch (field.value.type.element) {
            case BASE_TYPE_STRUCT: {
              std::string str_last_item_idx =
                  NumToString(field.value.type.fixed_length - 1);
              *body += "\n  for (let i = " + str_last_item_idx +
                       "; i >= 0; --i" + ") {\n";

              std::string fname = nameprefix.length()
                                      ? nameprefix + "_" + field.name
                                      : field.name;

              *body += "    const item = " + fname + "?.[i];\n\n";

              if (parser_.opts.generate_object_based_api) {
                *body += "    if (item instanceof " +
                         GetTypeName(*field.value.type.struct_def,
                                     /*object_api =*/true) +
                         ") {\n";
                *body += "      item.pack(builder);\n";
                *body += "      continue;\n";
                *body += "    }\n\n";
              }

              std::string class_name =
                  GetPrefixedName(*field.value.type.struct_def);
              std::string pack_func_create_call =
                  class_name + ".create" + class_name + "(builder,\n";
              pack_func_create_call +=
                  "    " +
                  GenStructMemberValueTS(*field.value.type.struct_def, "item",
                                         ",\n    ", false) +
                  "\n  ";
              *body += "    " + pack_func_create_call;
              *body += "  );\n  }\n\n";

              break;
            }
            default: {
              std::string str_last_item_idx =
                  NumToString(field.value.type.fixed_length - 1);
              std::string fname = nameprefix.length()
                                      ? nameprefix + "_" + field.name
                                      : field.name;

              *body += "\n  for (let i = " + str_last_item_idx +
                       "; i >= 0; --i) {\n";
              *body += "    builder.write";
              *body += GenWriteMethod(
                  static_cast<flatbuffers::Type>(field.value.type.element));
              *body += "(";
              *body += element_type == BASE_TYPE_BOOL ? "+" : "";

              if (element_type == BASE_TYPE_LONG ||
                  element_type == BASE_TYPE_ULONG) {
                *body += "BigInt(" + fname + "?.[i] ?? 0));\n";
              } else {
                *body += "(" + fname + "?.[i] ?? 0));\n\n";
              }
              *body += "  }\n\n";
              break;
            }
          }
        } else {
          std::string fname =
              nameprefix.length() ? nameprefix + "_" + field.name : field.name;

          *body += "  builder.write" + GenWriteMethod(field.value.type) + "(";
          if (field.value.type.base_type == BASE_TYPE_BOOL) {
            *body += "Number(Boolean(" + fname + ")));\n";
            continue;
          } else if (field.value.type.base_type == BASE_TYPE_LONG ||
                     field.value.type.base_type == BASE_TYPE_ULONG) {
            *body += "BigInt(" + fname + " ?? 0));\n";
            continue;
          }

          *body += fname + ");\n";
        }
      }
    }
  }